

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::MinSampleShadingInstance::verifyImage
          (TestStatus *__return_storage_ptr__,MinSampleShadingInstance *this,
          ConstPixelBufferAccess *testShadingImage,ConstPixelBufferAccess *minShadingImage,
          ConstPixelBufferAccess *maxShadingImage)

{
  TestContext *this_00;
  MessageBuilder *pMVar1;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  MessageBuilder local_1c8;
  TestLog *local_48;
  TestLog *log;
  deUint32 local_38;
  deUint32 maxColorCount;
  deUint32 minColorCount;
  deUint32 testColorCount;
  ConstPixelBufferAccess *maxShadingImage_local;
  ConstPixelBufferAccess *minShadingImage_local;
  ConstPixelBufferAccess *testShadingImage_local;
  MinSampleShadingInstance *this_local;
  
  _minColorCount = maxShadingImage;
  maxShadingImage_local = minShadingImage;
  minShadingImage_local = testShadingImage;
  testShadingImage_local = (ConstPixelBufferAccess *)this;
  this_local = (MinSampleShadingInstance *)__return_storage_ptr__;
  maxColorCount = getUniqueColorsCount(testShadingImage);
  local_38 = getUniqueColorsCount(maxShadingImage_local);
  log._4_4_ = getUniqueColorsCount(_minColorCount);
  this_00 = Context::getTestContext((this->super_TestInstance).m_context);
  local_48 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_1c8,local_48,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [16])"\nColors found: ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&maxColorCount);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x1387264);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [23])"Min. colors expected: ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_38);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x1387264);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [23])"Max. colors expected: ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)((long)&log + 4));
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x1387264);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1c8);
  if ((maxColorCount < local_38) || (log._4_4_ < maxColorCount)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"Unique colors out of expected bounds",&local_1f9);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"Unique colors within expected bounds",&local_221);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus MinSampleShadingInstance::verifyImage (const tcu::ConstPixelBufferAccess& testShadingImage, const tcu::ConstPixelBufferAccess& minShadingImage, const tcu::ConstPixelBufferAccess& maxShadingImage)
{
	const deUint32	testColorCount	= getUniqueColorsCount(testShadingImage);
	const deUint32	minColorCount	= getUniqueColorsCount(minShadingImage);
	const deUint32	maxColorCount	= getUniqueColorsCount(maxShadingImage);

	tcu::TestLog& log = m_context.getTestContext().getLog();

	log << tcu::TestLog::Message
		<< "\nColors found: " << testColorCount << "\n"
		<< "Min. colors expected: " << minColorCount << "\n"
		<< "Max. colors expected: " << maxColorCount << "\n"
		<< tcu::TestLog::EndMessage;

	if (minColorCount > testColorCount || testColorCount > maxColorCount)
		return tcu::TestStatus::fail("Unique colors out of expected bounds");
	else
		return tcu::TestStatus::pass("Unique colors within expected bounds");
}